

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatcc_json_parser.h
# Opt level: O3

char * flatcc_json_parser_bool(flatcc_json_parser_t *ctx,char *buf,char *end,uint8_t *v)

{
  char *loc;
  int err;
  bool bVar1;
  uint64_t value;
  int local_2c;
  uint64_t local_28;
  
  if (3 < (long)end - (long)buf) {
    if (*(int *)buf == 0x65757274) {
      *v = '\x01';
      return buf + 4;
    }
    if (((long)end - (long)buf != 4) && (buf[4] == 'e' && *(int *)buf == 0x736c6166)) {
      *v = '\0';
      return buf + 5;
    }
  }
  local_28 = 0;
  local_2c = 0;
  if (buf != end) {
    loc = flatcc_json_parser_integer(ctx,buf,end,&local_2c,&local_28);
    if (loc == buf) {
      bVar1 = false;
      goto LAB_0010ff96;
    }
    if (local_2c == 0) {
      if (local_28 < 0x100) {
        bVar1 = local_28 != 0;
        goto LAB_0010ff96;
      }
      err = 7;
    }
    else {
      err = 8;
    }
    buf = flatcc_json_parser_set_error(ctx,loc,end,err);
  }
  bVar1 = false;
  loc = buf;
LAB_0010ff96:
  *v = bVar1;
  return loc;
}

Assistant:

static inline const char *flatcc_json_parser_bool(flatcc_json_parser_t *ctx, const char *buf, const char *end, uint8_t *v)
{
    const char *k;
    uint8_t tmp;

    k = buf;
    if (end - buf >= 4 && memcmp(buf, "true", 4) == 0) {
        *v = 1;
        return k + 4;
    } else if (end - buf >= 5 && memcmp(buf, "false", 5) == 0) {
        *v = 0;
        return k + 5;
    }
    buf = flatcc_json_parser_uint8(ctx, buf, end, &tmp);
    *v = !!tmp;
    return buf;
}